

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseUDP.h
# Opt level: O0

void __thiscall tonk::UDPSocket::~UDPSocket(UDPSocket *this)

{
  unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  *in_RDI;
  unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  *this_00;
  
  (in_RDI->_M_t).
  super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  .
  super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
  ._M_head_impl =
       (basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *)
       &PTR__UDPSocket_002b4748;
  this_00 = in_RDI;
  std::__atomic_base<int>::operator--((__atomic_base<int> *)&ActiveUDPSocketCount,0);
  FloodDetector::~FloodDetector((FloodDetector *)0x19531d);
  std::shared_ptr<asio::io_context::strand>::~shared_ptr
            ((shared_ptr<asio::io_context::strand> *)0x19532d);
  std::
  unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  ::~unique_ptr(this_00);
  Dependencies::~Dependencies((Dependencies *)0x19534d);
  in_RDI[1]._M_t.
  super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  .
  super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
  ._M_head_impl =
       (basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *)
       &PTR__ConnectionAddrMap_002b4608;
  ConnectionMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::UDPAddressHasher>::~ConnectionMap
            ((ConnectionMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::UDPAddressHasher> *)
             0x195376);
  IUDPSender::~IUDPSender((IUDPSender *)in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

TONK_FORCE_INLINE virtual ~UDPSocket()
    {
        ActiveUDPSocketCount--;
    }